

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::PortalImageInfiniteLight::Phi(PortalImageInfiniteLight *this,SampledWavelengths *lambda)

{
  Image *this_00;
  Tuple2<pbrt::Point2,_int> TVar1;
  undefined1 auVar2 [16];
  Float *pFVar3;
  long lVar4;
  ulong uVar5;
  int c;
  int c_00;
  Point2i p;
  undefined1 auVar6 [16];
  Float FVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar11 [16];
  undefined1 auVar13 [56];
  SampledSpectrum SVar14;
  Float duv_dw;
  Float local_b4;
  Float local_b0;
  Float local_ac;
  ulong local_a8;
  Float local_9c;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  long local_80;
  PortalImageInfiniteLight *local_78;
  SampledWavelengths *local_70;
  RGB local_68;
  undefined1 local_58 [16];
  RGBIlluminantSpectrum local_48;
  undefined1 auVar10 [56];
  undefined1 auVar12 [64];
  
  local_70 = lambda;
  if ((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y < 1) {
    _local_98 = ZEXT816(0);
  }
  else {
    this_00 = &this->image;
    lVar4 = 0;
    _local_98 = ZEXT816(0);
    local_78 = this;
    do {
      local_80 = lVar4;
      if (0 < (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x) {
        local_a8 = lVar4 << 0x20;
        local_58 = ZEXT416((uint)((float)(int)lVar4 + 0.5));
        uVar5 = 0;
        do {
          c_00 = 0;
          local_ac = 0.0;
          local_b0 = 0.0;
          local_b4 = 0.0;
          p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_a8 | uVar5);
          do {
            FVar7 = Image::GetChannel(this_00,p,c_00,(WrapMode2D)0x200000002);
            this = local_78;
            pFVar3 = &local_ac;
            if (c_00 != 0) {
              if (c_00 == 1) {
                pFVar3 = &local_b0;
              }
              else {
                pFVar3 = &local_b4;
              }
            }
            *pFVar3 = FVar7;
            c_00 = c_00 + 1;
          } while (c_00 != 3);
          auVar2 = vinsertps_avx(ZEXT416((uint)((float)(int)uVar5 + 0.5)),
                                 ZEXT416((uint)local_58._0_4_),0x10);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = (local_78->image).resolution.super_Tuple2<pbrt::Point2,_int>;
          auVar6 = vcvtdq2ps_avx(auVar6);
          auVar6 = vdivps_avx(auVar2,auVar6);
          RenderFromImage(local_78,(Point2f)auVar6._0_8_,&local_9c);
          auVar6 = vinsertps_avx(ZEXT416((uint)local_ac),ZEXT416((uint)local_b0),0x10);
          auVar6 = vmaxps_avx(auVar6,_DAT_00453010);
          auVar10 = ZEXT856(auVar6._8_8_);
          auVar2 = vmaxss_avx(ZEXT416((uint)local_b4),ZEXT416(0));
          auVar13 = ZEXT856(auVar2._8_8_);
          local_68._0_8_ = vmovlps_avx(auVar6);
          local_68.b = auVar2._0_4_;
          RGBIlluminantSpectrum::RGBIlluminantSpectrum(&local_48,this->imageColorSpace,&local_68);
          SVar14 = RGBIlluminantSpectrum::Sample(&local_48,local_70);
          auVar12._0_8_ = SVar14.values.values._8_8_;
          auVar12._8_56_ = auVar13;
          auVar9._0_8_ = SVar14.values.values._0_8_;
          auVar9._8_56_ = auVar10;
          auVar6 = vmovlhps_avx(auVar9._0_16_,auVar12._0_16_);
          auVar2._4_4_ = local_9c;
          auVar2._0_4_ = local_9c;
          auVar2._8_4_ = local_9c;
          auVar2._12_4_ = local_9c;
          auVar6 = vdivps_avx512vl(auVar6,auVar2);
          local_98._0_4_ = auVar6._0_4_ + (float)local_98._0_4_;
          local_98._4_4_ = auVar6._4_4_ + (float)local_98._4_4_;
          fStack_90 = auVar6._8_4_ + fStack_90;
          fStack_8c = auVar6._12_4_ + fStack_8c;
          uVar5 = uVar5 + 1;
        } while ((long)uVar5 < (long)(this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x);
      }
      lVar4 = local_80 + 1;
    } while (lVar4 < (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y);
  }
  local_a8 = CONCAT44(local_a8._4_4_,this->scale);
  FVar7 = Area(this);
  local_a8._0_4_ = FVar7 * (float)local_a8;
  TVar1 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  auVar11._0_4_ = (float)(TVar1.x * TVar1.y);
  auVar8._0_4_ = (float)local_a8 * (float)local_98._0_4_;
  auVar8._4_4_ = (float)local_a8 * (float)local_98._4_4_;
  auVar8._8_4_ = (float)local_a8 * fStack_90;
  auVar8._12_4_ = (float)local_a8 * fStack_8c;
  auVar11._4_4_ = auVar11._0_4_;
  auVar11._8_4_ = auVar11._0_4_;
  auVar11._12_4_ = auVar11._0_4_;
  auVar6 = vdivps_avx(auVar8,auVar11);
  auVar2 = vshufpd_avx(auVar6,auVar6,1);
  SVar14.values.values._0_8_ = auVar6._0_8_;
  SVar14.values.values._8_8_ = auVar2._0_8_;
  return (SampledSpectrum)SVar14.values.values;
}

Assistant:

SampledSpectrum PortalImageInfiniteLight::Phi(const SampledWavelengths &lambda) const {
    // We're really computing fluence, then converting to power, for what
    // that's worth..
    SampledSpectrum sumL(0.);

    for (int y = 0; y < image.Resolution().y; ++y) {
        for (int x = 0; x < image.Resolution().x; ++x) {
            RGB rgb;
            for (int c = 0; c < 3; ++c)
                rgb[c] = image.GetChannel({x, y}, c);

            Point2f st((x + 0.5f) / image.Resolution().x,
                       (y + 0.5f) / image.Resolution().y);
            Float duv_dw;
            (void)RenderFromImage(st, &duv_dw);

            sumL +=
                RGBIlluminantSpectrum(*imageColorSpace, ClampZero(rgb)).Sample(lambda) /
                duv_dw;
        }
    }

    return scale * Area() * sumL / (image.Resolution().x * image.Resolution().y);
}